

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall
HighsSimplexAnalysis::updateInvertFormData(HighsSimplexAnalysis *this,HFactor *factor)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  this->num_invert = this->num_invert + 1;
  iVar1 = factor->invert_num_el;
  iVar2 = factor->basis_matrix_num_el;
  dVar3 = (double)iVar1 / (double)iVar2;
  this->sum_invert_fill_factor = this->sum_invert_fill_factor + dVar3;
  this->running_average_invert_fill_factor =
       this->running_average_invert_fill_factor * 0.95 + dVar3 * 0.05;
  if (factor->kernel_dim != 0) {
    dVar4 = (double)factor->kernel_dim / (double)this->numRow;
    this->num_kernel = this->num_kernel + 1;
    dVar3 = this->max_kernel_dim;
    if (this->max_kernel_dim <= dVar4) {
      dVar3 = dVar4;
    }
    this->max_kernel_dim = dVar3;
    this->sum_kernel_dim = this->sum_kernel_dim + dVar4;
    this->running_average_kernel_dim = this->running_average_kernel_dim * 0.95 + dVar4 * 0.05;
    dVar3 = (double)((iVar1 - iVar2) + factor->kernel_num_el) / (double)factor->kernel_num_el;
    this->sum_kernel_fill_factor = this->sum_kernel_fill_factor + dVar3;
    this->running_average_kernel_fill_factor =
         this->running_average_kernel_fill_factor * 0.95 + dVar3 * 0.05;
    if (0.1 < dVar4) {
      this->num_major_kernel = this->num_major_kernel + 1;
      this->sum_major_kernel_fill_factor = dVar3 + this->sum_major_kernel_fill_factor;
      this->running_average_major_kernel_fill_factor =
           this->running_average_major_kernel_fill_factor * 0.95 + dVar3 * 0.05;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::updateInvertFormData(const HFactor& factor) {
  assert(analyse_factor_data);
  const bool report_kernel = false;
  num_invert++;
  assert(factor.basis_matrix_num_el);
  double invert_fill_factor =
      ((1.0 * factor.invert_num_el) / factor.basis_matrix_num_el);
  if (report_kernel) printf("INVERT fill = %6.2f", invert_fill_factor);
  sum_invert_fill_factor += invert_fill_factor;
  running_average_invert_fill_factor =
      0.95 * running_average_invert_fill_factor + 0.05 * invert_fill_factor;

  double kernel_relative_dim = (1.0 * factor.kernel_dim) / numRow;
  if (report_kernel) printf("; kernel dim = %11.4g", kernel_relative_dim);
  if (factor.kernel_dim) {
    num_kernel++;
    max_kernel_dim = max(kernel_relative_dim, max_kernel_dim);
    sum_kernel_dim += kernel_relative_dim;
    running_average_kernel_dim =
        0.95 * running_average_kernel_dim + 0.05 * kernel_relative_dim;

    HighsInt kernel_invert_num_el =
        factor.invert_num_el -
        (factor.basis_matrix_num_el - factor.kernel_num_el);
    assert(factor.kernel_num_el);
    double kernel_fill_factor =
        (1.0 * kernel_invert_num_el) / factor.kernel_num_el;
    sum_kernel_fill_factor += kernel_fill_factor;
    running_average_kernel_fill_factor =
        0.95 * running_average_kernel_fill_factor + 0.05 * kernel_fill_factor;
    if (report_kernel) printf("; fill = %6.2f", kernel_fill_factor);
    const double kMajorKernelRelativeDimThreshold = 0.1;
    if (kernel_relative_dim > kMajorKernelRelativeDimThreshold) {
      num_major_kernel++;
      sum_major_kernel_fill_factor += kernel_fill_factor;
      running_average_major_kernel_fill_factor =
          0.95 * running_average_major_kernel_fill_factor +
          0.05 * kernel_fill_factor;
    }
  }
  if (report_kernel) printf("\n");
}